

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int type)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  undefined4 in_R8D;
  Mat m;
  bool local_e9;
  void *local_d8;
  int *local_d0;
  size_t local_c8;
  int local_c0;
  Allocator *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  Mat *in_stack_ffffffffffffff58;
  int local_a0;
  size_t local_98;
  
  (**(code **)(*in_RSI + 0x10))(&local_d8,in_RSI,in_EDX * in_ECX,in_R8D);
  local_e9 = local_d8 == (void *)0x0 || local_98 * (long)local_a0 == 0;
  if (local_e9) {
    in_RDI->data = local_d8;
    in_RDI->refcount = local_d0;
    in_RDI->elemsize = local_c8;
    in_RDI->elempack = local_c0;
    in_RDI->allocator = in_stack_ffffffffffffff48;
    in_RDI->dims = in_stack_ffffffffffffff50;
    in_RDI->w = in_stack_ffffffffffffff54;
    in_RDI->h = (int)in_stack_ffffffffffffff58;
    in_RDI->d = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
    in_RDI->c = local_a0;
    in_RDI->cstep = local_98;
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
  }
  else {
    Mat::reshape(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
  }
  if (local_d0 != (int *)0x0) {
    LOCK();
    iVar1 = *local_d0;
    *local_d0 = *local_d0 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (in_stack_ffffffffffffff48 == (Allocator *)0x0) {
        if (local_d8 != (void *)0x0) {
          free(local_d8);
        }
      }
      else {
        (*in_stack_ffffffffffffff48->_vptr_Allocator[3])(in_stack_ffffffffffffff48,local_d8);
      }
    }
  }
  return in_RDI;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}